

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_image_utils.cpp
# Opt level: O0

uint8 * crnlib::image_utils::read_image_from_memory
                  (uint8 *pImage,int nSize,int *pWidth,int *pHeight,int *pActualComps,int req_comps,
                  char *pFilename)

{
  undefined1 uVar1;
  undefined1 uVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  pixel_packer *packer_00;
  color_quad<unsigned_char,_int> *__src;
  uint *in_RCX;
  uint *in_RDX;
  undefined4 *in_R8;
  int in_R9D;
  uint32 n;
  pixel_packer packer;
  image_u8 luma_img;
  uint8 *pSrc;
  uint8 *pDst;
  image_u8 *pImg;
  image_u8 img;
  data_stream_serializer serializer;
  buffer_stream buf_stream;
  mipmapped_texture tex;
  mipmapped_texture *in_stack_fffffffffffffe28;
  mipmapped_texture *in_stack_fffffffffffffe30;
  image_u8 *in_stack_fffffffffffffe38;
  uint in_stack_fffffffffffffe40;
  uint in_stack_fffffffffffffe44;
  mipmapped_texture *in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe50;
  undefined2 in_stack_fffffffffffffe54;
  undefined1 in_stack_fffffffffffffe56;
  undefined1 in_stack_fffffffffffffe57;
  undefined5 in_stack_fffffffffffffe68;
  undefined1 in_stack_fffffffffffffe6d;
  undefined1 local_150 [56];
  mipmapped_texture *local_118;
  pixel_packer *local_110;
  undefined4 local_d4;
  data_stream_serializer local_d0 [2];
  data_stream local_b0;
  mipmapped_texture local_80;
  int local_34;
  undefined4 *local_30;
  uint *local_28;
  uint *local_20;
  mipmapped_texture *local_8;
  
  *in_RDX = 0;
  *in_RCX = 0;
  *in_R8 = 0;
  if ((in_R9D < 1) || (4 < in_R9D)) {
    local_8 = (mipmapped_texture *)0x0;
  }
  else {
    local_34 = in_R9D;
    local_30 = in_R8;
    local_28 = in_RCX;
    local_20 = in_RDX;
    mipmapped_texture::mipmapped_texture
              ((mipmapped_texture *)
               CONCAT17(in_stack_fffffffffffffe57,
                        CONCAT16(in_stack_fffffffffffffe56,
                                 CONCAT24(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50))));
    buffer_stream::buffer_stream
              ((buffer_stream *)
               CONCAT17(in_stack_fffffffffffffe57,
                        CONCAT16(in_stack_fffffffffffffe56,
                                 CONCAT24(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50))),
               in_stack_fffffffffffffe48,in_stack_fffffffffffffe44);
    data_stream::set_name
              ((data_stream *)in_stack_fffffffffffffe30,(char *)in_stack_fffffffffffffe28);
    data_stream_serializer::data_stream_serializer(local_d0,&local_b0);
    uVar1 = mipmapped_texture::read_from_stream
                      (in_stack_fffffffffffffe48,
                       (data_stream_serializer *)
                       CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                       (format)((ulong)in_stack_fffffffffffffe38 >> 0x20));
    if ((bool)uVar1) {
      uVar2 = mipmapped_texture::is_packed(in_stack_fffffffffffffe28);
      if ((!(bool)uVar2) ||
         (in_stack_fffffffffffffe6d =
               mipmapped_texture::unpack_from_dxt
                         (in_stack_fffffffffffffe48,SUB41(in_stack_fffffffffffffe44 >> 0x18,0)),
         (bool)in_stack_fffffffffffffe6d)) {
        image<crnlib::color_quad<unsigned_char,_int>_>::image
                  ((image<crnlib::color_quad<unsigned_char,_int>_> *)0x12fbc8);
        packer_00 = (pixel_packer *)
                    mipmapped_texture::get_level_image
                              (in_stack_fffffffffffffe48,in_stack_fffffffffffffe44,
                               in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                               (uint)((ulong)in_stack_fffffffffffffe30 >> 0x20));
        local_110 = packer_00;
        if (packer_00 == (pixel_packer *)0x0) {
          local_8 = (mipmapped_texture *)0x0;
        }
        else {
          uVar4 = mipmapped_texture::get_width(&local_80);
          *local_20 = uVar4;
          uVar5 = mipmapped_texture::get_height(&local_80);
          *local_28 = uVar5;
          bVar3 = image<crnlib::color_quad<unsigned_char,_int>_>::has_alpha
                            ((image<crnlib::color_quad<unsigned_char,_int>_> *)0x12fc8c);
          if (bVar3) {
            *local_30 = 4;
          }
          else {
            bVar3 = image<crnlib::color_quad<unsigned_char,_int>_>::is_grayscale
                              ((image<crnlib::color_quad<unsigned_char,_int>_> *)0x12fcb9);
            if (bVar3) {
              *local_30 = 1;
            }
            else {
              *local_30 = 3;
            }
          }
          local_118 = (mipmapped_texture *)0x0;
          if (local_34 == 4) {
            uVar4 = mipmapped_texture::get_total_pixels(&local_80);
            local_118 = (mipmapped_texture *)malloc((ulong)uVar4 << 2);
            __src = image<crnlib::color_quad<unsigned_char,_int>_>::get_ptr
                              ((image<crnlib::color_quad<unsigned_char,_int>_> *)local_110);
            in_stack_fffffffffffffe30 = local_118;
            local_150._48_8_ = __src;
            uVar4 = mipmapped_texture::get_total_pixels(&local_80);
            memcpy(in_stack_fffffffffffffe30,__src,(ulong)uVar4 << 2);
          }
          else {
            image<crnlib::color_quad<unsigned_char,_int>_>::image
                      ((image<crnlib::color_quad<unsigned_char,_int>_> *)0x12fdaa);
            if (local_34 == 1) {
              image<crnlib::color_quad<unsigned_char,_int>_>::operator=
                        ((image<crnlib::color_quad<unsigned_char,_int>_> *)in_stack_fffffffffffffe48
                         ,(image<crnlib::color_quad<unsigned_char,_int>_> *)
                          CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
              image<crnlib::color_quad<unsigned_char,_int>_>::convert_to_grayscale
                        ((image<crnlib::color_quad<unsigned_char,_int>_> *)
                         CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
              local_110 = (pixel_packer *)local_150;
            }
            pixel_packer::pixel_packer
                      ((pixel_packer *)in_stack_fffffffffffffe30,
                       (uint)((ulong)in_stack_fffffffffffffe28 >> 0x20),
                       (uint)in_stack_fffffffffffffe28,0,false);
            local_118 = (mipmapped_texture *)
                        pack_image<crnlib::image<crnlib::color_quad<unsigned_char,int>>>
                                  ((image<crnlib::color_quad<unsigned_char,_int>_> *)
                                   CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(in_stack_fffffffffffffe6d,
                                                                          in_stack_fffffffffffffe68)
                                                          )),packer_00,(uint *)CONCAT44(uVar4,uVar5)
                                  );
            image<crnlib::color_quad<unsigned_char,_int>_>::~image
                      ((image<crnlib::color_quad<unsigned_char,_int>_> *)0x12fe6a);
          }
          local_8 = local_118;
        }
        local_d4 = 1;
        image<crnlib::color_quad<unsigned_char,_int>_>::~image
                  ((image<crnlib::color_quad<unsigned_char,_int>_> *)0x12fe92);
      }
      else {
        local_8 = (mipmapped_texture *)0x0;
        local_d4 = 1;
      }
    }
    else {
      local_8 = (mipmapped_texture *)0x0;
      local_d4 = 1;
    }
    buffer_stream::~buffer_stream((buffer_stream *)0x12feb0);
    mipmapped_texture::~mipmapped_texture(in_stack_fffffffffffffe30);
  }
  return (uint8 *)local_8;
}

Assistant:

uint8* read_image_from_memory(const uint8* pImage, int nSize, int* pWidth, int* pHeight, int* pActualComps, int req_comps, const char* pFilename) {
  *pWidth = 0;
  *pHeight = 0;
  *pActualComps = 0;

  if ((req_comps < 1) || (req_comps > 4))
    return NULL;

  mipmapped_texture tex;

  buffer_stream buf_stream(pImage, nSize);
  buf_stream.set_name(pFilename);
  data_stream_serializer serializer(buf_stream);

  if (!tex.read_from_stream(serializer))
    return NULL;

  if (tex.is_packed()) {
    if (!tex.unpack_from_dxt(true))
      return NULL;
  }

  image_u8 img;
  image_u8* pImg = tex.get_level_image(0, 0, img);
  if (!pImg)
    return NULL;

  *pWidth = tex.get_width();
  *pHeight = tex.get_height();

  if (pImg->has_alpha())
    *pActualComps = 4;
  else if (pImg->is_grayscale())
    *pActualComps = 1;
  else
    *pActualComps = 3;

  uint8* pDst = NULL;
  if (req_comps == 4) {
    pDst = (uint8*)malloc(tex.get_total_pixels() * sizeof(uint32));
    uint8* pSrc = (uint8*)pImg->get_ptr();
    memcpy(pDst, pSrc, tex.get_total_pixels() * sizeof(uint32));
  } else {
    image_u8 luma_img;
    if (req_comps == 1) {
      luma_img = *pImg;
      luma_img.convert_to_grayscale();
      pImg = &luma_img;
    }

    pixel_packer packer(req_comps, 8);
    uint32 n;
    pDst = image_utils::pack_image(*pImg, packer, n);
  }

  return pDst;
}